

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O1

void __thiscall Assimp::ASE::Parser::ParseLV2LightSettingsBlock(Parser *this,Light *light)

{
  byte bVar1;
  char *pcVar2;
  byte *pbVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  char *pcVar8;
  ai_real *fOut;
  
  iVar6 = 0;
LAB_004127d5:
  do {
    while (pcVar2 = this->filePtr, *pcVar2 != '*') {
LAB_00412937:
      pbVar3 = (byte *)this->filePtr;
      bVar1 = *pbVar3;
      uVar5 = (uint)bVar1;
      if (bVar1 == 0x7b) {
        iVar6 = iVar6 + 1;
      }
      else if (bVar1 == 0x7d) {
        iVar6 = iVar6 + -1;
        if (iVar6 == 0) {
          this->filePtr = (char *)(pbVar3 + 1);
          SkipToNextToken(this);
          return;
        }
      }
      else if (uVar5 == 0) {
        LogError(this,"Encountered unexpected EOL while parsing a LIGHT_SETTINGS chunk (Level 2)");
      }
      if (((uVar5 < 0xe) && ((0x3401U >> (uVar5 & 0x1f) & 1) != 0)) &&
         (this->bLastWasEndLine == false)) {
        this->iLineNumber = this->iLineNumber + 1;
        this->bLastWasEndLine = true;
      }
      else {
        this->bLastWasEndLine = false;
      }
      this->filePtr = (char *)(pbVar3 + 1);
    }
    this->filePtr = pcVar2 + 1;
    iVar4 = strncmp("LIGHT_COLOR",pcVar2 + 1,0xb);
    if (iVar4 == 0) {
      bVar1 = pcVar2[0xc];
      if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
        pcVar8 = pcVar2 + 0xd;
        if (bVar1 == 0) {
          pcVar8 = pcVar2 + 0xc;
        }
        this->filePtr = pcVar8;
        lVar7 = 0;
        do {
          ParseLV4MeshFloat(this,(ai_real *)((long)&(light->mColor).r + lVar7));
          lVar7 = lVar7 + 4;
        } while (lVar7 != 0xc);
        goto LAB_004127d5;
      }
    }
    pcVar2 = this->filePtr;
    iVar4 = strncmp("LIGHT_INTENS",pcVar2,0xc);
    if (iVar4 != 0) {
LAB_00412819:
      pcVar2 = this->filePtr;
      iVar4 = strncmp("LIGHT_HOTSPOT",pcVar2,0xd);
      if (iVar4 == 0) {
        bVar1 = pcVar2[0xd];
        if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          pcVar8 = pcVar2 + 0xe;
          fOut = &light->mAngle;
          if (bVar1 == 0) {
            pcVar8 = pcVar2 + 0xd;
          }
          goto LAB_00412927;
        }
      }
      pcVar2 = this->filePtr;
      iVar4 = strncmp("LIGHT_FALLOFF",pcVar2,0xd);
      if (iVar4 == 0) {
        bVar1 = pcVar2[0xd];
        if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          pcVar8 = pcVar2 + 0xe;
          fOut = &light->mFalloff;
          if (bVar1 == 0) {
            pcVar8 = pcVar2 + 0xd;
          }
          goto LAB_00412927;
        }
      }
      goto LAB_00412937;
    }
    bVar1 = pcVar2[0xc];
    if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
    goto LAB_00412819;
    pcVar8 = pcVar2 + 0xd;
    fOut = &light->mIntensity;
    if (bVar1 == 0) {
      pcVar8 = pcVar2 + 0xc;
    }
LAB_00412927:
    this->filePtr = pcVar8;
    ParseLV4MeshFloat(this,fOut);
  } while( true );
}

Assistant:

void Parser::ParseLV2LightSettingsBlock(ASE::Light& light)
{
    AI_ASE_PARSER_INIT();
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;
            if (TokenMatch(filePtr,"LIGHT_COLOR" ,11))
            {
                ParseLV4MeshFloatTriple(&light.mColor.r);
                continue;
            }
            if (TokenMatch(filePtr,"LIGHT_INTENS" ,12))
            {
                ParseLV4MeshFloat(light.mIntensity);
                continue;
            }
            if (TokenMatch(filePtr,"LIGHT_HOTSPOT" ,13))
            {
                ParseLV4MeshFloat(light.mAngle);
                continue;
            }
            if (TokenMatch(filePtr,"LIGHT_FALLOFF" ,13))
            {
                ParseLV4MeshFloat(light.mFalloff);
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("2","LIGHT_SETTINGS");
    }
    return;
}